

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Alloc.h
# Opt level: O0

void __thiscall
Minisat::RegionAllocator<unsigned_int>::moveTo
          (RegionAllocator<unsigned_int> *this,RegionAllocator<unsigned_int> *to)

{
  RegionAllocator<unsigned_int> *to_local;
  RegionAllocator<unsigned_int> *this_local;
  
  if (to->memory != (uint *)0x0) {
    ::free(to->memory);
  }
  to->memory = this->memory;
  to->sz = this->sz;
  to->cap = this->cap;
  to->wasted_ = this->wasted_;
  this->memory = (uint *)0x0;
  this->wasted_ = 0;
  this->cap = 0;
  this->sz = 0;
  return;
}

Assistant:

void     moveTo(RegionAllocator& to) {
        if (to.memory != NULL) ::free(to.memory);
        to.memory = memory;
        to.sz = sz;
        to.cap = cap;
        to.wasted_ = wasted_;

        memory = NULL;
        sz = cap = wasted_ = 0;
    }